

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fetch.hpp
# Opt level: O1

void __thiscall
TI::TMS::SMSFetcher<(TI::TMS::Personality)4>::SMSFetcher
          (SMSFetcher<(TI::TMS::Personality)4> *this,Base<(TI::TMS::Personality)4> *base,uint8_t y)

{
  int iVar1;
  bool bVar2;
  AddressT AVar3;
  uint uVar4;
  ushort uVar5;
  ushort uVar6;
  undefined7 in_register_00000011;
  
  this->base = base;
  this->storage = &base->super_Storage<(TI::TMS::Personality)4,_void>;
  this->y = y;
  if ((0xf < y) ||
     (uVar4 = 0,
     (base->super_Storage<(TI::TMS::Personality)4,_void>).horizontal_scroll_lock_ == false)) {
    uVar4 = (uint)(base->fetch_line_buffer_->latched_horizontal_scroll >> 3);
  }
  this->horizontal_offset = uVar4;
  iVar1 = (base->mode_timing_).pixel_lines;
  bVar2 = iVar1 != 0xc0;
  uVar5 = (base->super_Storage<(TI::TMS::Personality)4,_void>).pattern_name_address_;
  uVar4 = ((uint)(base->super_Storage<(TI::TMS::Personality)4,_void>).latched_vertical_scroll_ +
          (int)CONCAT71(in_register_00000011,y)) % ((uint)bVar2 * 0x20 + 0xe0);
  (this->scrolled_row_info).pattern_address_base =
       ((((ushort)uVar4 & 0xf8) * 8 - 0x800 & ((ushort)bVar2 << 0xb | uVar5)) +
       (ushort)(iVar1 == 0xc0) * 0x100) - 0x100;
  uVar6 = (ushort)((uVar4 & 7) << 2);
  (this->scrolled_row_info).sub_row[0] = uVar6;
  (this->scrolled_row_info).sub_row[1] = uVar6 ^ 0x1c;
  if ((base->super_Storage<(TI::TMS::Personality)4,_void>).vertical_scroll_lock_ == true) {
    (this->static_row_info).pattern_address_base =
         ((ushort)(iVar1 == 0xc0) * 0x100 + (uVar5 & (ushort)y * 8 & 0xffc0)) - 0x900;
    uVar5 = (y & 7) << 2;
    (this->static_row_info).sub_row[0] = uVar5;
    (this->static_row_info).sub_row[1] = uVar5 ^ 0x1c;
    return;
  }
  (this->static_row_info).sub_row[1] = (this->scrolled_row_info).sub_row[1];
  AVar3 = (this->scrolled_row_info).sub_row[0];
  (this->static_row_info).pattern_address_base = (this->scrolled_row_info).pattern_address_base;
  (this->static_row_info).sub_row[0] = AVar3;
  return;
}

Assistant:

SMSFetcher(Base<personality> *base, uint8_t y) :
		base(base),
		storage(static_cast<Storage<personality> *>(base)),
		y(y),
		horizontal_offset((y >= 16 || !storage->horizontal_scroll_lock_) ? (base->fetch_line_buffer_->latched_horizontal_scroll >> 3) : 0)
	{
		// Limit address bits in use if this is a SMS2 mode.
		const bool is_tall_mode = base->mode_timing_.pixel_lines != 192;
		const AddressT pattern_name_address = storage->pattern_name_address_ | (is_tall_mode ? 0x800 : 0);
		const AddressT pattern_name_offset = is_tall_mode ? 0x100 : 0;

		// Determine row info for the screen both (i) if vertical scrolling is applied; and (ii) if it isn't.
		// The programmer can opt out of applying vertical scrolling to the right-hand portion of the display.
		const int scrolled_row = (y + storage->latched_vertical_scroll_) % (is_tall_mode ? 256 : 224);
		scrolled_row_info.pattern_address_base = (pattern_name_address & bits<11>(AddressT((scrolled_row & ~7) << 3))) - pattern_name_offset;
		scrolled_row_info.sub_row[0] = AddressT((scrolled_row & 7) << 2);
		scrolled_row_info.sub_row[1] = AddressT(28 ^ ((scrolled_row & 7) << 2));
		if(storage->vertical_scroll_lock_) {
			static_row_info.pattern_address_base = bits<11>(AddressT(pattern_name_address & ((y & ~7) << 3))) - pattern_name_offset;
			static_row_info.sub_row[0] = AddressT((y & 7) << 2);
			static_row_info.sub_row[1] = 28 ^ AddressT((y & 7) << 2);
		} else static_row_info = scrolled_row_info;
	}